

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::BringWindowToFocusFront(ImGuiWindow *window)

{
  uint uVar1;
  uint uVar2;
  ImGuiWindow **ppIVar3;
  ImGuiContext *pIVar4;
  long lVar5;
  uint uVar6;
  
  pIVar4 = GImGui;
  uVar2 = (GImGui->WindowsFocusOrder).Size;
  if ((long)(int)uVar2 < 1) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.h"
                  ,0x662,"T &ImVector<ImGuiWindow *>::back() [T = ImGuiWindow *]");
  }
  ppIVar3 = (GImGui->WindowsFocusOrder).Data;
  if ((ppIVar3[(long)(int)uVar2 + -1] != window) && (uVar2 != 1)) {
    lVar5 = 0;
    uVar6 = uVar2 - 1;
    do {
      uVar1 = uVar6 - 1;
      if (ppIVar3[uVar1] == window) {
        if (uVar6 < uVar2) {
          memmove(ppIVar3 + uVar1,ppIVar3 + (ulong)(uVar2 - 1) + lVar5,(long)(1 - (int)lVar5) << 3);
          lVar5 = (long)(pIVar4->WindowsFocusOrder).Size;
          if (0 < lVar5) {
            (pIVar4->WindowsFocusOrder).Data[lVar5 + -1] = window;
            return;
          }
        }
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.h"
                      ,0x658,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      lVar5 = lVar5 + -1;
      uVar6 = uVar1;
    } while (0 < (int)uVar1);
  }
  return;
}

Assistant:

void ImGui::BringWindowToFocusFront(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    if (g.WindowsFocusOrder.back() == window)
        return;
    for (int i = g.WindowsFocusOrder.Size - 2; i >= 0; i--) // We can ignore the top-most window
        if (g.WindowsFocusOrder[i] == window)
        {
            memmove(&g.WindowsFocusOrder[i], &g.WindowsFocusOrder[i + 1], (size_t)(g.WindowsFocusOrder.Size - i - 1) * sizeof(ImGuiWindow*));
            g.WindowsFocusOrder[g.WindowsFocusOrder.Size - 1] = window;
            break;
        }
}